

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

int NGA_Create64(int type,int ndim,int64_t *dims,char *name,int64_t *chunk)

{
  ulong uVar1;
  Integer *chunk_00;
  logical lVar2;
  int iVar3;
  ulong uVar4;
  Integer g_a;
  Integer _ga_work [7];
  Integer _ga_dims [7];
  int local_90 [2];
  Integer local_88 [7];
  int64_t iStack_50;
  Integer local_48 [8];
  
  iVar3 = 0;
  if (ndim < 8) {
    if (ndim < 1) {
      chunk_00 = local_88;
      if (chunk == (int64_t *)0x0) {
        chunk_00 = chunk;
      }
    }
    else {
      uVar4 = (ulong)(uint)ndim;
      uVar1 = uVar4;
      do {
        (&iStack_50)[uVar1] = *dims;
        dims = dims + 1;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
      chunk_00 = local_88;
      if (chunk == (int64_t *)0x0) {
        chunk_00 = chunk;
      }
      if (chunk != (int64_t *)0x0 && 0 < ndim) {
        do {
          uVar4 = uVar4 - 1;
          local_88[uVar4] = *chunk;
          chunk = chunk + 1;
          chunk_00 = local_88;
        } while (uVar4 != 0);
      }
    }
    lVar2 = pnga_create((long)type,(long)ndim,local_48,name,chunk_00,(Integer *)local_90);
    iVar3 = 0;
    if (lVar2 == 1) {
      iVar3 = local_90[0];
    }
  }
  return iVar3;
}

Assistant:

int NGA_Create64(int type, int ndim, int64_t dims[], char *name, int64_t *chunk)
{
    Integer *ptr, g_a; 
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    if(!chunk)ptr=(Integer*)0;  
    else {
         COPYC2F(chunk,_ga_work, ndim);
         ptr = _ga_work;
    }
    st = wnga_create((Integer)type, (Integer)ndim, _ga_dims, name, ptr, &g_a);
    if(st==TRUE) return (int) g_a;
    else return 0;
}